

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkCheckNvectorOptional(ARKodeMem ark_mem)

{
  int line;
  char *msgfmt;
  
  if (((ark_mem->user_efun == 0) && (ark_mem->atolmin0 != 0)) &&
     (ark_mem->tempv1->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0)) {
    msgfmt = "N_VMin unimplemented (required by error-weight function)";
    line = 0x777;
  }
  else if (((ark_mem->user_rfun == 0) && (ark_mem->rwt_is_ewt == 0)) &&
          ((ark_mem->Ratolmin0 != 0 &&
           (ark_mem->tempv1->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0)))) {
    msgfmt = "N_VMin unimplemented (required by residual-weight function)";
    line = 0x77e;
  }
  else {
    if (((ark_mem->h0u == 0.0) && (!NAN(ark_mem->h0u))) &&
       ((ark_mem->hin == 0.0 && (!NAN(ark_mem->hin))))) {
      if (ark_mem->tempv1->ops->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0) {
        msgfmt = "N_VDiv unimplemented (required for initial step estimation)";
        line = 0x788;
        goto LAB_00165fa8;
      }
      if (ark_mem->tempv1->ops->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0) {
        msgfmt = "N_VMaxNorm unimplemented (required for initial step estimation)";
        line = 0x78f;
        goto LAB_00165fa8;
      }
    }
    if ((ark_mem->itol == 0) &&
       (ark_mem->tempv1->ops->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0)) {
      msgfmt = "N_VAddConst unimplemented (required for scalar abstol)";
      line = 0x798;
    }
    else {
      if (ark_mem->rwt_is_ewt != 0) {
        return 1;
      }
      if (ark_mem->ritol != 0) {
        return 1;
      }
      if (ark_mem->tempv1->ops->nvaddconst != (_func_void_N_Vector_sunrealtype_N_Vector *)0x0) {
        return 1;
      }
      msgfmt = "N_VAddConst unimplemented (required for scalar rabstol)";
      line = 0x79f;
    }
  }
LAB_00165fa8:
  arkProcessError(ark_mem,-0x16,line,"arkCheckNvectorOptional",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return 0;
}

Assistant:

sunbooleantype arkCheckNvectorOptional(ARKodeMem ark_mem)
{
  /* If using a built-in routine for error/residual weights with abstol==0,
     ensure that N_VMin is available */
  if ((!ark_mem->user_efun) && (ark_mem->atolmin0) &&
      (!ark_mem->tempv1->ops->nvmin))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VMin unimplemented (required by error-weight function)");
    return (SUNFALSE);
  }
  if ((!ark_mem->user_rfun) && (!ark_mem->rwt_is_ewt) && (ark_mem->Ratolmin0) &&
      (!ark_mem->tempv1->ops->nvmin))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "N_VMin unimplemented (required by residual-weight function)");
    return (SUNFALSE);
  }

  /* If the user has not specified a step size (and it will be estimated
     internally), ensure that N_VDiv and N_VMaxNorm are available */
  if ((ark_mem->h0u == ZERO) && (ark_mem->hin == ZERO) &&
      (!ark_mem->tempv1->ops->nvdiv))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "N_VDiv unimplemented (required for initial step estimation)");
    return (SUNFALSE);
  }
  if ((ark_mem->h0u == ZERO) && (ark_mem->hin == ZERO) &&
      (!ark_mem->tempv1->ops->nvmaxnorm))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "N_VMaxNorm unimplemented (required for initial step estimation)");
    return (SUNFALSE);
  }

  /* If using a scalar-valued absolute tolerance (for either the state or
     residual), then ensure that N_VAddConst is available */
  if ((ark_mem->itol == ARK_SS) && (!ark_mem->tempv1->ops->nvaddconst))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VAddConst unimplemented (required for scalar abstol)");
    return (SUNFALSE);
  }
  if ((!ark_mem->rwt_is_ewt) && (ark_mem->ritol == ARK_SS) &&
      (!ark_mem->tempv1->ops->nvaddconst))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VAddConst unimplemented (required for scalar rabstol)");
    return (SUNFALSE);
  }

  /* If we made it here, then the vector is sufficient */
  return (SUNTRUE);
}